

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void print_attr(exr_attribute_t *a,int verbose)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  int in_ESI;
  undefined8 *in_RDI;
  uintptr_t faddr_destroy;
  uintptr_t faddr_pack;
  uintptr_t faddr_unpack;
  uint8_t rndMode;
  uint8_t lvlMode;
  int i_1;
  int i;
  int c;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 uVar5;
  char *local_98;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_60;
  char *local_58;
  char *local_50;
  int local_18;
  int local_14;
  int local_10;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if (in_RDI != (undefined8 *)0x0) {
    printf("%s: ",*in_RDI);
    if (in_ESI != 0) {
      printf("%s ",in_RDI[1]);
    }
    switch(*(undefined4 *)((long)in_RDI + 0x14)) {
    case 0:
    case 0x1f:
    default:
      printf("<ERROR Unknown type \'%s\'>",in_RDI[1]);
      break;
    case 1:
      printf("[ %d, %d - %d %d ] %d x %d",(ulong)*(uint *)in_RDI[3],(ulong)*(uint *)(in_RDI[3] + 4),
             (ulong)*(uint *)(in_RDI[3] + 8),(ulong)*(uint *)(in_RDI[3] + 0xc),
             (ulong)((*(int *)(in_RDI[3] + 8) - *(int *)in_RDI[3]) + 1),
             CONCAT44(uVar4,(*(int *)(in_RDI[3] + 0xc) - *(int *)(in_RDI[3] + 4)) + 1));
      break;
    case 2:
      printf("[ %g, %g - %g %g ]",(double)*(float *)in_RDI[3],(double)*(float *)(in_RDI[3] + 4),
             (double)*(float *)(in_RDI[3] + 8),(double)*(float *)(in_RDI[3] + 0xc));
      break;
    case 3:
      printf("%d channels\n",(ulong)*(uint *)in_RDI[3]);
      for (local_10 = 0; local_10 < *(int *)in_RDI[3]; local_10 = local_10 + 1) {
        if (0 < local_10) {
          printf("\n");
        }
        if (*(int *)(*(long *)(in_RDI[3] + 8) + (long)local_10 * 0x20 + 0x10) == 0) {
          local_50 = "uint";
        }
        else {
          if (*(int *)(*(long *)(in_RDI[3] + 8) + (long)local_10 * 0x20 + 0x10) == 1) {
            local_58 = "half";
          }
          else {
            local_58 = "<UNKNOWN>";
            if (*(int *)(*(long *)(in_RDI[3] + 8) + (long)local_10 * 0x20 + 0x10) == 2) {
              local_58 = "float";
            }
          }
          local_50 = local_58;
        }
        printf("   \'%s\': %s samp %d %d",
               *(undefined8 *)(*(long *)(in_RDI[3] + 8) + (long)local_10 * 0x20 + 8),local_50,
               (ulong)*(uint *)(*(long *)(in_RDI[3] + 8) + (long)local_10 * 0x20 + 0x18),
               (ulong)*(uint *)(*(long *)(in_RDI[3] + 8) + (long)local_10 * 0x20 + 0x1c));
      }
      break;
    case 4:
      printf("r[%g, %g] g[%g, %g] b[%g, %g] w[%g, %g]",(double)*(float *)in_RDI[3],
             (double)*(float *)(in_RDI[3] + 4),(double)*(float *)(in_RDI[3] + 8),
             (double)*(float *)(in_RDI[3] + 0xc),(double)*(float *)(in_RDI[3] + 0x10),
             (double)*(float *)(in_RDI[3] + 0x14),(double)*(float *)(in_RDI[3] + 0x18),
             (double)*(float *)(in_RDI[3] + 0x1c));
      break;
    case 5:
      if (*(byte *)(in_RDI + 3) < 10) {
        local_60 = print_attr::compressionnames[*(byte *)(in_RDI + 3)];
      }
      else {
        local_60 = "<UNKNOWN>";
      }
      printf("\'%s\'",local_60);
      if (in_ESI != 0) {
        printf(" (0x%02X)",(ulong)*(byte *)(in_RDI + 3));
      }
      break;
    case 6:
      printf("%g",in_RDI[3]);
      break;
    case 7:
      pcVar3 = "cube";
      if (*(char *)(in_RDI + 3) == '\0') {
        pcVar3 = "latlong";
      }
      printf("%s",pcVar3);
      break;
    case 8:
      printf("%g",(double)*(float *)(in_RDI + 3));
      break;
    case 9:
      printf("[%d entries]:\n   ",(ulong)*(uint *)in_RDI[3]);
      for (local_14 = 0; local_14 < *(int *)in_RDI[3]; local_14 = local_14 + 1) {
        printf(" %g",(double)*(float *)(*(long *)(in_RDI[3] + 8) + (long)local_14 * 4));
      }
      break;
    case 10:
      printf("%d",(ulong)*(uint *)(in_RDI + 3));
      break;
    case 0xb:
      printf("mfgc %d film %d prefix %d count %d perf_off %d ppf %d ppc %d",
             (ulong)*(uint *)in_RDI[3],(ulong)*(uint *)(in_RDI[3] + 4),
             (ulong)*(uint *)(in_RDI[3] + 8),(ulong)*(uint *)(in_RDI[3] + 0xc),
             (ulong)*(uint *)(in_RDI[3] + 0x10),CONCAT44(uVar4,*(undefined4 *)(in_RDI[3] + 0x14)),
             CONCAT44(uVar5,*(undefined4 *)(in_RDI[3] + 0x18)));
      break;
    case 0xc:
      if (*(char *)(in_RDI + 3) == '\0') {
        local_70 = "increasing";
      }
      else {
        if (*(char *)(in_RDI + 3) == '\x01') {
          local_78 = "decreasing";
        }
        else {
          local_78 = "<UNKNOWN>";
          if (*(char *)(in_RDI + 3) == '\x02') {
            local_78 = "random";
          }
        }
        local_70 = local_78;
      }
      printf("%d (%s)",(ulong)*(byte *)(in_RDI + 3),local_70);
      break;
    case 0xd:
      printf("[ [%g %g %g] [%g %g %g] [%g %g %g] ]",(double)*(float *)in_RDI[3],
             (double)*(float *)(in_RDI[3] + 4),(double)*(float *)(in_RDI[3] + 8),
             (double)*(float *)(in_RDI[3] + 0xc),(double)*(float *)(in_RDI[3] + 0x10),
             (double)*(float *)(in_RDI[3] + 0x14),(double)*(float *)(in_RDI[3] + 0x18),
             (double)*(float *)(in_RDI[3] + 0x1c));
      break;
    case 0xe:
      printf("[ [%g %g %g] [%g %g %g] [%g %g %g] ]",*(undefined8 *)in_RDI[3],
             *(undefined8 *)(in_RDI[3] + 8),*(undefined8 *)(in_RDI[3] + 0x10),
             *(undefined8 *)(in_RDI[3] + 0x18),*(undefined8 *)(in_RDI[3] + 0x20),
             *(undefined8 *)(in_RDI[3] + 0x28),*(undefined8 *)(in_RDI[3] + 0x30),
             *(undefined8 *)(in_RDI[3] + 0x38));
      break;
    case 0xf:
      printf("[ [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] ]",
             (double)*(float *)in_RDI[3],(double)*(float *)(in_RDI[3] + 4),
             (double)*(float *)(in_RDI[3] + 8),(double)*(float *)(in_RDI[3] + 0xc),
             (double)*(float *)(in_RDI[3] + 0x10),(double)*(float *)(in_RDI[3] + 0x14),
             (double)*(float *)(in_RDI[3] + 0x18),(double)*(float *)(in_RDI[3] + 0x1c));
      break;
    case 0x10:
      printf("[ [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] ]",*(undefined8 *)in_RDI[3],
             *(undefined8 *)(in_RDI[3] + 8),*(undefined8 *)(in_RDI[3] + 0x10),
             *(undefined8 *)(in_RDI[3] + 0x18),*(undefined8 *)(in_RDI[3] + 0x20),
             *(undefined8 *)(in_RDI[3] + 0x28),*(undefined8 *)(in_RDI[3] + 0x30),
             *(undefined8 *)(in_RDI[3] + 0x38));
      break;
    case 0x11:
      printf("%u x %u",(ulong)*(uint *)in_RDI[3],(ulong)*(uint *)(in_RDI[3] + 4));
      break;
    case 0x12:
      printf("%d / %u",(ulong)*(uint *)in_RDI[3],(ulong)*(uint *)(in_RDI[3] + 4));
      if (*(int *)(in_RDI[3] + 4) != 0) {
        printf(" (%g)",(double)*(int *)in_RDI[3] / (double)(uint)((int *)in_RDI[3])[1]);
      }
      break;
    case 0x13:
      if (*(long *)(in_RDI[3] + 8) == 0) {
        local_80 = "<NULL>";
      }
      else {
        local_80 = *(char **)(in_RDI[3] + 8);
      }
      printf("\'%s\'",local_80);
      break;
    case 0x14:
      printf("[%d entries]:\n",(ulong)*(uint *)in_RDI[3]);
      for (local_18 = 0; local_18 < *(int *)in_RDI[3]; local_18 = local_18 + 1) {
        if (0 < local_18) {
          printf("\n");
        }
        printf("    \'%s\'",*(undefined8 *)(*(long *)(in_RDI[3] + 8) + (long)local_18 * 0x10 + 8));
      }
      break;
    case 0x15:
      bVar2 = *(byte *)(in_RDI[3] + 8) & 0xf;
      bVar1 = (byte)((int)(uint)*(byte *)(in_RDI[3] + 8) >> 4);
      if (bVar2 < 3) {
        local_98 = print_attr::lvlModes[bVar2];
      }
      else {
        local_98 = "<UNKNOWN>";
      }
      pcVar3 = "up";
      if (bVar1 == 0) {
        pcVar3 = "down";
      }
      printf("size %u x %u level %u (%s) round %u (%s)",(ulong)*(uint *)in_RDI[3],
             (ulong)*(uint *)(in_RDI[3] + 4),(ulong)bVar2,local_98,(ulong)bVar1,pcVar3);
      break;
    case 0x16:
      printf("time %u user %u",(ulong)*(uint *)in_RDI[3],(ulong)*(uint *)(in_RDI[3] + 4));
      break;
    case 0x17:
      printf("[ %d, %d ]",(ulong)*(uint *)in_RDI[3],(ulong)*(uint *)(in_RDI[3] + 4));
      break;
    case 0x18:
      printf("[ %g, %g ]",(double)*(float *)in_RDI[3],(double)*(float *)(in_RDI[3] + 4));
      break;
    case 0x19:
      printf("[ %g, %g ]",*(undefined8 *)in_RDI[3],*(undefined8 *)(in_RDI[3] + 8));
      break;
    case 0x1a:
      printf("[ %d, %d, %d ]",(ulong)*(uint *)in_RDI[3],(ulong)*(uint *)(in_RDI[3] + 4),
             (ulong)*(uint *)(in_RDI[3] + 8));
      break;
    case 0x1b:
      printf("[ %g, %g, %g ]",(double)*(float *)in_RDI[3],(double)*(float *)(in_RDI[3] + 4),
             (double)*(float *)(in_RDI[3] + 8));
      break;
    case 0x1c:
      printf("[ %g, %g, %g ]",*(undefined8 *)in_RDI[3],*(undefined8 *)(in_RDI[3] + 8),
             *(undefined8 *)(in_RDI[3] + 0x10));
      break;
    case 0x1e:
      printf("(size %d unp size %d hdlrs %p %p %p)",(ulong)*(uint *)in_RDI[3],
             (ulong)*(uint *)(in_RDI[3] + 4),*(undefined8 *)(in_RDI[3] + 0x20),
             *(undefined8 *)(in_RDI[3] + 0x28),*(undefined8 *)(in_RDI[3] + 0x30));
    }
  }
  return;
}

Assistant:

static void
print_attr (const exr_attribute_t* a, int verbose)
{
    if (!a) return;

    printf ("%s: ", a->name);
    if (verbose) printf ("%s ", a->type_name);
    switch (a->type)
    {
        case EXR_ATTR_BOX2I:
            printf (
                "[ %d, %d - %d %d ] %d x %d",
                a->box2i->min.x,
                a->box2i->min.y,
                a->box2i->max.x,
                a->box2i->max.y,
                a->box2i->max.x - a->box2i->min.x + 1,
                a->box2i->max.y - a->box2i->min.y + 1);
            break;
        case EXR_ATTR_BOX2F:
            printf (
                "[ %g, %g - %g %g ]",
                (double) a->box2f->min.x,
                (double) a->box2f->min.y,
                (double) a->box2f->max.x,
                (double) a->box2f->max.y);
            break;
        case EXR_ATTR_CHLIST:
            printf ("%d channels\n", a->chlist->num_channels);
            for (int c = 0; c < a->chlist->num_channels; ++c)
            {
                if (c > 0) printf ("\n");
                printf (
                    "   '%s': %s samp %d %d",
                    a->chlist->entries[c].name.str,
                    (a->chlist->entries[c].pixel_type == EXR_PIXEL_UINT
                         ? "uint"
                         : (a->chlist->entries[c].pixel_type == EXR_PIXEL_HALF
                                ? "half"
                            : a->chlist->entries[c].pixel_type ==
                                    EXR_PIXEL_FLOAT
                                ? "float"
                                : "<UNKNOWN>")),
                    a->chlist->entries[c].x_sampling,
                    a->chlist->entries[c].y_sampling);
            }
            break;
        case EXR_ATTR_CHROMATICITIES:
            printf (
                "r[%g, %g] g[%g, %g] b[%g, %g] w[%g, %g]",
                (double) a->chromaticities->red_x,
                (double) a->chromaticities->red_y,
                (double) a->chromaticities->green_x,
                (double) a->chromaticities->green_y,
                (double) a->chromaticities->blue_x,
                (double) a->chromaticities->blue_y,
                (double) a->chromaticities->white_x,
                (double) a->chromaticities->white_y);
            break;
        case EXR_ATTR_COMPRESSION: {
            static char* compressionnames[] = {
                "none",
                "rle",
                "zips",
                "zip",
                "piz",
                "pxr24",
                "b44",
                "b44a",
                "dwaa",
                "dwab"};
            printf (
                "'%s'", (a->uc < 10 ? compressionnames[a->uc] : "<UNKNOWN>"));
            if (verbose) printf (" (0x%02X)", a->uc);
            break;
        }
        case EXR_ATTR_DOUBLE: printf ("%g", a->d); break;
        case EXR_ATTR_ENVMAP:
            printf ("%s", a->uc == 0 ? "latlong" : "cube");
            break;
        case EXR_ATTR_FLOAT: printf ("%g", (double) a->f); break;
        case EXR_ATTR_FLOAT_VECTOR:
            printf ("[%d entries]:\n   ", a->floatvector->length);
            for (int i = 0; i < a->floatvector->length; ++i)
                printf (" %g", (double) a->floatvector->arr[i]);
            break;
        case EXR_ATTR_INT: printf ("%d", a->i); break;
        case EXR_ATTR_KEYCODE:
            printf (
                "mfgc %d film %d prefix %d count %d perf_off %d ppf %d ppc %d",
                a->keycode->film_mfc_code,
                a->keycode->film_type,
                a->keycode->prefix,
                a->keycode->count,
                a->keycode->perf_offset,
                a->keycode->perfs_per_frame,
                a->keycode->perfs_per_count);
            break;
        case EXR_ATTR_LINEORDER:
            printf (
                "%d (%s)",
                (int) a->uc,
                a->uc == EXR_LINEORDER_INCREASING_Y
                    ? "increasing"
                    : (a->uc == EXR_LINEORDER_DECREASING_Y
                           ? "decreasing"
                           : (a->uc == EXR_LINEORDER_RANDOM_Y ? "random"
                                                              : "<UNKNOWN>")));
            break;
        case EXR_ATTR_M33F:
            printf (
                "[ [%g %g %g] [%g %g %g] [%g %g %g] ]",
                (double) a->m33f->m[0],
                (double) a->m33f->m[1],
                (double) a->m33f->m[2],
                (double) a->m33f->m[3],
                (double) a->m33f->m[4],
                (double) a->m33f->m[5],
                (double) a->m33f->m[6],
                (double) a->m33f->m[7],
                (double) a->m33f->m[8]);
            break;
        case EXR_ATTR_M33D:
            printf (
                "[ [%g %g %g] [%g %g %g] [%g %g %g] ]",
                a->m33d->m[0],
                a->m33d->m[1],
                a->m33d->m[2],
                a->m33d->m[3],
                a->m33d->m[4],
                a->m33d->m[5],
                a->m33d->m[6],
                a->m33d->m[7],
                a->m33d->m[8]);
            break;
        case EXR_ATTR_M44F:
            printf (
                "[ [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] ]",
                (double) a->m44f->m[0],
                (double) a->m44f->m[1],
                (double) a->m44f->m[2],
                (double) a->m44f->m[3],
                (double) a->m44f->m[4],
                (double) a->m44f->m[5],
                (double) a->m44f->m[6],
                (double) a->m44f->m[7],
                (double) a->m44f->m[8],
                (double) a->m44f->m[9],
                (double) a->m44f->m[10],
                (double) a->m44f->m[11],
                (double) a->m44f->m[12],
                (double) a->m44f->m[13],
                (double) a->m44f->m[14],
                (double) a->m44f->m[15]);
            break;
        case EXR_ATTR_M44D:
            printf (
                "[ [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] [%g %g %g %g] ]",
                a->m44d->m[0],
                a->m44d->m[1],
                a->m44d->m[2],
                a->m44d->m[3],
                a->m44d->m[4],
                a->m44d->m[5],
                a->m44d->m[6],
                a->m44d->m[7],
                a->m44d->m[8],
                a->m44d->m[9],
                a->m44d->m[10],
                a->m44d->m[11],
                a->m44d->m[12],
                a->m44d->m[13],
                a->m44d->m[14],
                a->m44d->m[15]);
            break;
        case EXR_ATTR_PREVIEW:
            printf ("%u x %u", a->preview->width, a->preview->height);
            break;
        case EXR_ATTR_RATIONAL:
            printf ("%d / %u", a->rational->num, a->rational->denom);
            if (a->rational->denom != 0)
                printf (
                    " (%g)",
                    (double) (a->rational->num) /
                        (double) (a->rational->denom));
            break;
        case EXR_ATTR_STRING:
            printf ("'%s'", a->string->str ? a->string->str : "<NULL>");
            break;
        case EXR_ATTR_STRING_VECTOR:
            printf ("[%d entries]:\n", a->stringvector->n_strings);
            for (int i = 0; i < a->stringvector->n_strings; ++i)
            {
                if (i > 0) printf ("\n");
                printf ("    '%s'", a->stringvector->strings[i].str);
            }
            break;
        case EXR_ATTR_TILEDESC: {
            static const char* lvlModes[] = {
                "single image", "mipmap", "ripmap"};
            uint8_t lvlMode =
                (uint8_t) EXR_GET_TILE_LEVEL_MODE (*(a->tiledesc));
            uint8_t rndMode =
                (uint8_t) EXR_GET_TILE_ROUND_MODE (*(a->tiledesc));
            printf (
                "size %u x %u level %u (%s) round %u (%s)",
                a->tiledesc->x_size,
                a->tiledesc->y_size,
                lvlMode,
                lvlMode < 3 ? lvlModes[lvlMode] : "<UNKNOWN>",
                rndMode,
                rndMode == 0 ? "down" : "up");
            break;
        }
        case EXR_ATTR_TIMECODE:
            printf (
                "time %u user %u",
                a->timecode->time_and_flags,
                a->timecode->user_data);
            break;
        case EXR_ATTR_V2I: printf ("[ %d, %d ]", a->v2i->x, a->v2i->y); break;
        case EXR_ATTR_V2F:
            printf ("[ %g, %g ]", (double) a->v2f->x, (double) a->v2f->y);
            break;
        case EXR_ATTR_V2D: printf ("[ %g, %g ]", a->v2d->x, a->v2d->y); break;
        case EXR_ATTR_V3I:
            printf ("[ %d, %d, %d ]", a->v3i->x, a->v3i->y, a->v3i->z);
            break;
        case EXR_ATTR_V3F:
            printf (
                "[ %g, %g, %g ]",
                (double) a->v3f->x,
                (double) a->v3f->y,
                (double) a->v3f->z);
            break;
        case EXR_ATTR_V3D:
            printf ("[ %g, %g, %g ]", a->v3d->x, a->v3d->y, a->v3d->z);
            break;
        case EXR_ATTR_OPAQUE: {
            uintptr_t faddr_unpack = (uintptr_t) a->opaque->unpack_func_ptr;
            uintptr_t faddr_pack   = (uintptr_t) a->opaque->pack_func_ptr;
            uintptr_t faddr_destroy =
                (uintptr_t) a->opaque->destroy_unpacked_func_ptr;
            printf (
                "(size %d unp size %d hdlrs %p %p %p)",
                a->opaque->size,
                a->opaque->unpacked_size,
                (void*) faddr_unpack,
                (void*) faddr_pack,
                (void*) faddr_destroy);
            break;
        }
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: printf ("<ERROR Unknown type '%s'>", a->type_name); break;
    }
}